

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Network.cpp
# Opt level: O0

void __thiscall xmrig::Network::onActive(Network *this)

{
  IClient *in_stack_00000050;
  IStrategy *in_stack_00000058;
  Network *in_stack_00000060;
  
  onActive(in_stack_00000060,in_stack_00000058,in_stack_00000050);
  return;
}

Assistant:

void xmrig::Network::onActive(IStrategy *strategy, IClient *client)
{
    m_state.onActive(client);

    const char *tlsVersion = client->tlsVersion();
    LOG_INFO("%s " WHITE_BOLD("use %s ") CYAN_BOLD("%s:%d ") GREEN_BOLD("%s") " " BLACK_BOLD("%s"),
             tag, client->mode(), client->pool().host().data(), client->pool().port(), tlsVersion ? tlsVersion : "", client->ip().data());

    const char *fingerprint = client->tlsFingerprint();
    if (fingerprint != nullptr) {
        LOG_INFO("%s " BLACK_BOLD("fingerprint (SHA-256): \"%s\""), tag, fingerprint);
    }
}